

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

string * draco::LowercaseFileExtension(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  string sStack_38;
  
  lVar1 = std::__cxx11::string::rfind((char)filename,0x2e);
  if ((lVar1 + 1U < 2) || (lVar1 == filename->_M_string_length - 1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&sStack_38);
  }
  else {
    std::__cxx11::string::substr((ulong)&sStack_38,(ulong)filename);
    parser::ToLower(__return_storage_ptr__,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LowercaseFileExtension(const std::string &filename) {
  const size_t pos = filename.find_last_of('.');
  if (pos == 0 || pos == std::string::npos || pos == filename.length() - 1) {
    return "";
  }
  return parser::ToLower(filename.substr(pos + 1));
}